

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

pizza_cutter * parse_input_file(pizza_cutter *__return_storage_ptr__,string *file_name)

{
  pizza_cutter *ppVar1;
  char cVar2;
  istream *piVar3;
  char *pcVar4;
  int j;
  int iVar5;
  int iVar6;
  int cols;
  int max_total;
  int min_each;
  int rows;
  pizza_cell local_288;
  pizza_cutter *local_280;
  pizza_row_t row;
  pizza_t pizza;
  ifstream ifs;
  
  std::ifstream::ifstream(&ifs,(string *)file_name,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_280 = __return_storage_ptr__;
    piVar3 = (istream *)std::istream::operator>>((istream *)&ifs,&rows);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&cols);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&min_each);
    std::istream::operator>>(piVar3,&max_total);
    std::istream::get();
    pizza.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pizza.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pizza.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar6 = 0; ppVar1 = local_280, iVar6 < rows; iVar6 = iVar6 + 1) {
      row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<pizza_cell,_std::allocator<pizza_cell>_>::reserve
                ((vector<pizza_cell,_std::allocator<pizza_cell>_> *)
                 &row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>,(long)cols);
      for (iVar5 = 0; iVar5 < cols; iVar5 = iVar5 + 1) {
        local_288.ingr = std::istream::get();
        local_288.owner = -1;
        std::vector<pizza_cell,_std::allocator<pizza_cell>_>::emplace_back<pizza_cell>
                  ((vector<pizza_cell,_std::allocator<pizza_cell>_> *)
                   &row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>,&local_288);
      }
      std::
      vector<std::vector<pizza_cell,std::allocator<pizza_cell>>,std::allocator<std::vector<pizza_cell,std::allocator<pizza_cell>>>>
      ::emplace_back<std::vector<pizza_cell,std::allocator<pizza_cell>>>
                ((vector<std::vector<pizza_cell,std::allocator<pizza_cell>>,std::allocator<std::vector<pizza_cell,std::allocator<pizza_cell>>>>
                  *)&pizza,
                 (vector<pizza_cell,_std::allocator<pizza_cell>_> *)
                 &row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>);
      std::istream::get();
      std::_Vector_base<pizza_cell,_std::allocator<pizza_cell>_>::~_Vector_base
                (&row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>);
    }
    local_280->max_total_ = max_total;
    local_280->min_each_ = min_each;
    (local_280->pizza_).
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         pizza.
         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_280->pizza_).
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         pizza.
         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_280->pizza_).
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         pizza.
         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pizza.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pizza.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pizza.
    super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_280->slices_).super__Vector_base<pizza_slice,_std::allocator<pizza_slice>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_280->slices_).super__Vector_base<pizza_slice,_std::allocator<pizza_slice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_280->slices_).super__Vector_base<pizza_slice,_std::allocator<pizza_slice>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ::~vector(&pizza);
    std::ifstream::~ifstream(&ifs);
    return ppVar1;
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x20);
  pizza.
  super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)std::iostream_category();
  pizza.
  super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(pizza.
                         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"Cannot open the input file.");
  __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

pizza_cutter parse_input_file(const std::string& file_name) {
    std::ifstream ifs(file_name);

    if (!ifs.is_open()) {
        throw std::ios_base::failure("Cannot open the input file.");
    }

    int rows, cols, min_each, max_total;
    ifs >> rows >> cols >> min_each >> max_total;
    ifs.get();

    pizza_t pizza;
    for (int i = 0; i < rows; ++i) {
        pizza_row_t row;
        row.reserve(cols);

        for (int j = 0; j < cols; ++j) {
            char val = ifs.get();
            row.push_back(pizza_cell{val});
        }

        pizza.push_back(std::move(row));
        ifs.get();
    }

    return pizza_cutter(min_each, max_total, std::move(pizza));
}